

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resumable_io.c
# Opt level: O3

void Qiniu_Rio_doTask(void *params)

{
  ulong uVar1;
  uint blkIdx;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  _Qiniu_Uploading_Parts_Progress *progress;
  _func_void_size_t_size_t *p_Var7;
  uint uVar8;
  Qiniu_Writer w;
  Qiniu_Writer w_00;
  uint uVar9;
  Qiniu_Retry_Decision QVar10;
  int iVar11;
  Qiniu_Client *self;
  char *pcVar12;
  cJSON *object;
  cJSON *pcVar13;
  ulong uVar14;
  undefined8 uVar15;
  int iVar16;
  Qiniu_Reader QVar17;
  Qiniu_Error QVar18;
  Qiniu_ReaderAt r;
  Qiniu_ReaderAt r_00;
  Qiniu_Rio_BlkputRet ret;
  Qiniu_Crc32 crc32;
  Qiniu_Writer h;
  Qiniu_Section section;
  Qiniu_Tee tee;
  char *local_188;
  long local_170;
  Qiniu_Rio_BlkputRet local_148;
  undefined8 local_110;
  long *local_108;
  ulong local_100;
  Qiniu_Crc32 local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  Qiniu_FnReadAt local_d8;
  void *local_d0;
  long *local_c8;
  long *local_c0;
  _Qiniu_Progress_Callback_Data_conflict local_b8;
  Qiniu_Writer local_90;
  Qiniu_Section local_78;
  Qiniu_Tee local_58;
  
  uVar15 = *(undefined8 *)((long)params + 0x20);
  lVar4 = *(long *)((long)params + 0x28);
  lVar5 = *(long *)((long)params + 0x18);
  plVar6 = *(long **)((long)params + 0x30);
  self = (Qiniu_Client *)
         (**(code **)(*(long *)(lVar5 + 0x40) + 8))
                   (*(undefined8 *)(lVar5 + 0x38),*(undefined8 *)((long)params + 0x10));
  if (0 < **(long **)((long)params + 0x40)) {
    free(params);
    Qiniu_Count_Inc(*(Qiniu_Count **)((long)params + 0x40));
    (**(code **)(lVar4 + 8))(uVar15);
    return;
  }
  blkIdx = *(uint *)((long)params + 0x48);
  iVar16 = *(int *)(lVar5 + 0xc);
  local_148.host = (char *)0x0;
  local_148.economical = 0;
  local_148._44_4_ = 0;
  local_148.crc32 = 0;
  local_148.offset = 0;
  local_148.expiredAt = 0;
  local_148.ctx = (char *)0x0;
  local_148.checksum = (char *)0x0;
  local_c0 = (long *)(lVar5 + 0x78);
  local_e0 = (long)(int)blkIdx << 0x16;
  local_e8 = (long)(int)blkIdx * 0x30;
  local_110 = uVar15;
  local_f0 = lVar4;
  local_c8 = plVar6;
  do {
    Qiniu_Rio_BlkputRet_Assign
              (&local_148,(Qiniu_Rio_BlkputRet *)(*(long *)(lVar5 + 0x28) + local_e8));
    uVar9 = Qiniu_OK.code;
    uVar2 = *(uint *)((long)params + 0x4c);
    iVar11 = *(int *)((long)params + 0x50);
    progress = *(_Qiniu_Uploading_Parts_Progress **)((long)params + 0x58);
    local_d0 = *params;
    local_d8 = *(Qiniu_FnReadAt *)((long)params + 8);
    local_188 = Qiniu_OK.message;
    Qiniu_Crc32Writer(&local_90,&local_f8,0);
    uVar3 = *(uint *)(lVar5 + 8);
    local_b8._16_8_ = 0;
    local_b8.progress = (_Qiniu_Uploading_Parts_Progress *)0x0;
    local_b8.totalSize = 0;
    local_b8.previousUlNow = 0;
    local_b8.callback = (_func_void_size_t_size_t *)0x0;
    p_Var7 = *(_func_void_size_t_size_t **)(lVar5 + 0x90);
    if (p_Var7 != (_func_void_size_t_size_t *)0x0) {
      local_b8._20_4_ = 0;
      local_b8.blkIdx = blkIdx;
      local_b8.totalSize = (long)iVar11;
      local_b8.progress = progress;
      local_b8.callback = p_Var7;
    }
    local_100 = 1;
    local_108 = local_c0;
    if (*local_c0 == 0) {
      local_108 = *(long **)(lVar5 + 0x80);
      local_100 = *(ulong *)(lVar5 + 0x88);
    }
    if (local_148.ctx == (char *)0x0) {
      uVar8 = uVar2;
      if ((int)uVar3 < (int)uVar2) {
        uVar8 = uVar3;
      }
      if (0 < *(int *)(lVar5 + 0xc)) {
        uVar14 = 0xffffffffffffffff;
        do {
          uVar1 = uVar14 + 1;
          r_00.ReadAt = local_d8;
          r_00.self = local_d0;
          QVar17 = Qiniu_SectionReader(&local_78,r_00,local_e0,(long)(int)uVar8);
          w_00.Write = local_90.Write;
          w_00.self = local_90.self;
          w_00.Flush = local_90.Flush;
          QVar17 = Qiniu_TeeReader(&local_58,QVar17,w_00);
          pcVar12 = Qiniu_String_Format(0x80,"%s/mkblk/%d",local_108[uVar1 % local_100],(ulong)uVar2
                                       );
          QVar18 = Qiniu_Rio_bput(self,&local_148,QVar17,uVar8,pcVar12,&local_b8);
          local_188 = QVar18.message;
          uVar9 = QVar18.code;
          Qiniu_Free(pcVar12);
          if (uVar9 == 200) {
            if (*(long *)(lVar5 + 0x90) != 0) {
              _Qiniu_Uploading_Parts_Progress_Part_Uploaded(progress,blkIdx,(long)(int)uVar8);
            }
            goto LAB_001183f3;
          }
          if (*(long *)(lVar5 + 0x90) != 0) {
            _Qiniu_Uploading_Parts_Progress_Set_Progress(progress,blkIdx,0);
          }
          QVar10 = _Qiniu_Should_Retry(uVar9);
        } while (((QVar10 != QINIU_DONT_RETRY) && ((long)(uVar14 + 2) < (long)*(int *)(lVar5 + 0xc))
                 ) && (uVar14 = uVar1, uVar1 < self->hostsRetriesMax));
        local_170 = 0;
        goto LAB_00118341;
      }
      if (uVar9 != 200) {
        local_170 = 0;
        goto LAB_00118341;
      }
LAB_001183f3:
      uVar9 = 0x26ac;
      if (local_f8.val == (local_148._16_8_ & 0xffffffff)) {
        pcVar12 = "unmatched checksum";
        if (local_148.offset != uVar8) goto LAB_00118360;
        iVar11 = (**(code **)(lVar5 + 0x18))(*(undefined8 *)(lVar5 + 0x10),blkIdx,uVar2,&local_148);
        if (iVar11 != 1) {
          uVar9 = 200;
          local_170 = 1;
          goto LAB_00117f76;
        }
        goto LAB_001184b8;
      }
      pcVar12 = "unmatched checksum";
    }
    else {
      if (p_Var7 != (_func_void_size_t_size_t *)0x0) {
        _Qiniu_Uploading_Parts_Progress_Part_Uploaded
                  (progress,blkIdx,(ulong)local_148._16_8_ >> 0x20);
      }
      local_170 = 0;
LAB_00117f76:
      if ((int)local_148.offset < (int)uVar2) {
LAB_00117f8e:
        uVar8 = uVar2 - local_148.offset;
        if ((int)uVar3 < (int)(uVar2 - local_148.offset)) {
          uVar8 = uVar3;
        }
        uVar14 = self->hostsRetriesMax + 1;
        iVar11 = (int)uVar14;
        if ((ulong)(long)*(int *)(lVar5 + 0xc) <= uVar14) {
          iVar11 = *(int *)(lVar5 + 0xc);
        }
        uVar14 = (ulong)iVar11;
        uVar9 = local_148.offset;
        do {
          local_f8.val = 0;
          r.ReadAt = local_d8;
          r.self = local_d0;
          QVar17 = Qiniu_SectionReader(&local_78,r,(ulong)uVar9 + local_e0,(long)(int)uVar8);
          w.Write = local_90.Write;
          w.self = local_90.self;
          w.Flush = local_90.Flush;
          QVar17 = Qiniu_TeeReader(&local_58,QVar17,w);
          pcVar12 = Qiniu_String_Format(0x400,"%s/bput/%s/%d",local_108[uVar14 % local_100],
                                        local_148.ctx,(ulong)local_148._16_8_ >> 0x20);
          QVar18 = Qiniu_Rio_bput(self,&local_148,QVar17,uVar8,pcVar12,&local_b8);
          local_188 = QVar18.message;
          uVar9 = QVar18.code;
          Qiniu_Free(pcVar12);
          if (uVar9 == 200) {
            local_170 = local_170 + 1;
            if (local_f8.val == (local_148._16_8_ & 0xffffffff)) goto LAB_00118171;
            Qiniu_Stderr_Warn("ResumableBlockput: invalid checksum, retry");
            uVar9 = 0x26ac;
            lVar4 = *(long *)(lVar5 + 0x90);
            local_188 = "unmatched checksum";
          }
          else {
            if (uVar9 == 0x2bd) {
              Qiniu_Rio_BlkputRet_Cleanup(&local_148);
              Qiniu_Stderr_Warn("ResumableBlockput: invalid ctx, please retry");
              uVar9 = 0x2bd;
              pcVar12 = local_188;
              goto LAB_00118360;
            }
            Qiniu_Stderr_Warn("ResumableBlockput %d off:%d failed - %E",(ulong)blkIdx,
                              (ulong)local_148._16_8_ >> 0x20,(ulong)uVar9,local_188);
            lVar4 = *(long *)(lVar5 + 0x90);
          }
          if (lVar4 != 0) {
            _Qiniu_Uploading_Parts_Progress_Set_Progress(progress,blkIdx,0);
          }
          if (((long)uVar14 < 2) ||
             (QVar10 = _Qiniu_Should_Retry(uVar9), QVar10 == QINIU_DONT_RETRY)) break;
          uVar14 = uVar14 - 1;
          Qiniu_Stderr_Info("ResumableBlockput %E, retrying ...",(ulong)uVar9,local_188);
          uVar9 = local_148.offset;
        } while( true );
      }
LAB_00118341:
      if (uVar9 == 200) {
LAB_001184fd:
        Qiniu_Rio_BlkputRet_Assign
                  ((Qiniu_Rio_BlkputRet *)(local_e8 + *(long *)(lVar5 + 0x28)),&local_148);
        uVar15 = local_110;
        if ((local_c8 != (long *)0x0 && local_170 != 0) && (lVar4 = *local_c8, lVar4 != 0)) {
          object = cJSON_CreateObject();
          pcVar13 = cJSON_CreateNumber((double)(int)blkIdx);
          cJSON_AddItemToObject(object,"blkIdx",pcVar13);
          pcVar13 = cJSON_CreateString(local_148.ctx);
          cJSON_AddItemToObject(object,"ctx",pcVar13);
          pcVar13 = cJSON_CreateString(local_148.checksum);
          cJSON_AddItemToObject(object,"checksum",pcVar13);
          pcVar13 = cJSON_CreateNumber((double)(local_148._16_8_ & 0xffffffff));
          cJSON_AddItemToObject(object,"crc32",pcVar13);
          pcVar13 = cJSON_CreateNumber((double)((ulong)local_148._16_8_ >> 0x20));
          cJSON_AddItemToObject(object,"offset",pcVar13);
          pcVar13 = cJSON_CreateNumber(((double)CONCAT44(0x45300000,
                                                         (int)(local_148.expiredAt >> 0x20)) -
                                       1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)local_148.expiredAt) -
                                       4503599627370496.0));
          cJSON_AddItemToObject(object,"expiredAt",pcVar13);
          pcVar13 = cJSON_CreateString(local_148.host);
          cJSON_AddItemToObject(object,"host",pcVar13);
          pcVar12 = cJSON_PrintUnformatted(object);
          cJSON_Delete(object);
          if (pcVar12 != (char *)0x0) {
            (**(code **)(lVar4 + 0x10))(lVar4,pcVar12,0);
            free(pcVar12);
          }
        }
        goto LAB_0011849c;
      }
      pcVar12 = local_188;
      if (uVar9 == 0x26af) {
LAB_001184b8:
        Qiniu_Rio_BlkputRet_Cleanup(&local_148);
        Qiniu_Count_Inc(*(Qiniu_Count **)((long)params + 0x40));
        free(params);
        uVar15 = local_110;
        goto LAB_001184db;
      }
    }
LAB_00118360:
    local_188 = pcVar12;
    if ((iVar16 < 2) || (QVar10 = _Qiniu_Should_Retry(uVar9), QVar10 == QINIU_DONT_RETRY)) {
      Qiniu_Stderr_Warn("resumable.Put %d failed: %E",(ulong)blkIdx,(ulong)uVar9,local_188);
      (**(code **)(lVar5 + 0x20))
                (*(undefined8 *)(lVar5 + 0x10),*(undefined4 *)((long)params + 0x48),
                 *(undefined4 *)((long)params + 0x4c),uVar9,local_188);
      **(int **)((long)params + 0x38) = **(int **)((long)params + 0x38) + 1;
      uVar15 = local_110;
LAB_0011849c:
      Qiniu_Rio_BlkputRet_Cleanup(&local_148);
      free(params);
LAB_001184db:
      (**(code **)(local_f0 + 8))(uVar15);
      return;
    }
    iVar16 = iVar16 + -1;
    Qiniu_Stderr_Info("resumable.Put %E, retrying ...",(ulong)uVar9,local_188);
  } while( true );
LAB_00118171:
  iVar11 = (**(code **)(lVar5 + 0x18))(*(undefined8 *)(lVar5 + 0x10),blkIdx,uVar2,&local_148);
  if (iVar11 == 1) goto LAB_001184b8;
  if (*(long *)(lVar5 + 0x90) != 0) {
    _Qiniu_Uploading_Parts_Progress_Part_Uploaded(progress,blkIdx,(long)(int)uVar8);
  }
  if ((int)uVar2 <= (int)local_148.offset) goto LAB_001184fd;
  goto LAB_00117f8e;
}

Assistant:

static void Qiniu_Rio_doTask(void *params)
{
    Qiniu_Rio_BlkputRet ret;
    Qiniu_Rio_task *task = (Qiniu_Rio_task *)params;
    Qiniu_Rio_WaitGroup wg = task->wg;
    Qiniu_Rio_PutExtra *extra = task->extra;
    Qiniu_Rio_Recorder *recorder = task->recorder;
    Qiniu_Rio_ThreadModel tm = extra->threadModel;
    Qiniu_Client *c = tm.itbl->ClientTls(tm.self, task->mc);
    int blkIdx = task->blkIdx;
    int tryTimes = extra->tryTimes;
    size_t chunksUploaded = 0;

    if ((*task->ninterrupts) > 0)
    {
        free(task);
        Qiniu_Count_Inc(task->ninterrupts);
        wg.itbl->Done(wg.self);
        return;
    }

    memset(&ret, 0, sizeof(ret));

lzRetry:
    Qiniu_Rio_BlkputRet_Assign(&ret, &extra->progresses[blkIdx]);
    Qiniu_Error err = Qiniu_Rio_ResumableBlockput(c, &ret, task->f, blkIdx, task->blkSize1, task->fsize, task->progress, extra, &chunksUploaded);
    if (err.code != 200)
    {
        if (err.code == Qiniu_Rio_PutInterrupted)
        {
            // Terminate the upload process if the caller requests
            Qiniu_Rio_BlkputRet_Cleanup(&ret);
            Qiniu_Count_Inc(task->ninterrupts);
            free(task);
            wg.itbl->Done(wg.self);
            return;
        }

        if (tryTimes > 1 && _Qiniu_Should_Retry(err.code) != QINIU_DONT_RETRY)
        {
            tryTimes--;
            Qiniu_Log_Info("resumable.Put %E, retrying ...", err);
            goto lzRetry;
        }
        Qiniu_Log_Warn("resumable.Put %d failed: %E", blkIdx, err);
        extra->notifyErr(extra->notifyRecvr, task->blkIdx, task->blkSize1, err);
        (*task->nfails)++;
    }
    else
    {
        Qiniu_Rio_BlkputRet_Assign(&extra->progresses[blkIdx], &ret);
        if (chunksUploaded > 0 && recorder != NULL && recorder->recorderMedium != NULL)
        {
            Qiniu_Rio_Recorder_Write_Medium(recorder->recorderMedium, blkIdx, &ret);
        }
    }
    Qiniu_Rio_BlkputRet_Cleanup(&ret);
    free(task);
    wg.itbl->Done(wg.self);
}